

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_free_table(char **azResult)

{
  char *pcVar1;
  long lVar2;
  
  if (azResult != (char **)0x0) {
    pcVar1 = azResult[-1];
    if (1 < (int)(uint)pcVar1) {
      lVar2 = 0;
      do {
        if (azResult[lVar2] != (char *)0x0) {
          sqlite3_free(azResult[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while ((ulong)((uint)pcVar1 & 0x7fffffff) - 1 != lVar2);
    }
    sqlite3_free(azResult + -1);
    return;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free_table(
  char **azResult            /* Result returned from from sqlite3_get_table() */
){
  if( azResult ){
    int i, n;
    azResult--;
    assert( azResult!=0 );
    n = SQLITE_PTR_TO_INT(azResult[0]);
    for(i=1; i<n; i++){ if( azResult[i] ) sqlite3_free(azResult[i]); }
    sqlite3_free(azResult);
  }
}